

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-messages.c
# Opt level: O3

void borg_free_messages(void)

{
  char *p;
  long lVar1;
  char **p_00;
  
  mem_free(borg_msg_use);
  borg_msg_use = (int16_t *)0x0;
  mem_free(borg_msg_pos);
  borg_msg_pos = (int16_t *)0x0;
  borg_msg_num = 0;
  mem_free(borg_msg_buf);
  borg_msg_buf = (char *)0x0;
  borg_msg_siz = 0;
  if (suffix_pain != (char **)0x0) {
    p = *suffix_pain;
    p_00 = suffix_pain;
    if (p != (char *)0x0) {
      lVar1 = 8;
      do {
        mem_free(p);
        p_00 = suffix_pain;
        *(undefined8 *)((long)suffix_pain + lVar1 + -8) = 0;
        p = *(char **)((long)p_00 + lVar1);
        lVar1 = lVar1 + 8;
      } while (p != (char *)0x0);
    }
    mem_free(p_00);
    suffix_pain = (char **)0x0;
  }
  clean_msgs(&suffix_hit_by);
  clean_msgs(&spell_invis_msgs);
  clean_msgs(&spell_msgs);
  return;
}

Assistant:

void borg_free_messages(void)
{
    int i;

    mem_free(borg_msg_use);
    borg_msg_use = NULL;
    mem_free(borg_msg_pos);
    borg_msg_pos = NULL;
    borg_msg_num = 0;
    mem_free(borg_msg_buf);
    borg_msg_buf = NULL;
    borg_msg_siz = 0;

    if (suffix_pain) {
        for (i = 0; suffix_pain[i]; ++i) {
            mem_free(suffix_pain[i]);
            suffix_pain[i] = NULL;
        }
        mem_free(suffix_pain);
        suffix_pain = NULL;
    }
    clean_msgs(&suffix_hit_by);
    clean_msgs(&spell_invis_msgs);
    clean_msgs(&spell_msgs);
}